

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entries.cpp
# Opt level: O2

Data * DL::Expressions::anonymous_func(Data *__return_storage_ptr__,vector_t<Data> *args,VM *vm)

{
  pointer pDVar1;
  DataGroup *this;
  vector_t<Data> *pvVar2;
  Data *data;
  pointer data_00;
  DataGroup grp;
  Data d;
  allocator local_b1;
  DataGroup local_b0;
  string_t local_a0;
  Data local_80;
  
  union_func(&local_80,args,vm);
  if (local_80.mType == DT_Group) {
    std::__cxx11::string::string((string *)&local_a0,"",&local_b1);
    DataGroup::DataGroup(&local_b0,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    this = Data::getGroup(&local_80);
    pvVar2 = DataGroup::getAnonymousEntries(this);
    pDVar1 = (pvVar2->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (data_00 = (pvVar2->super__Vector_base<DL::Data,_std::allocator<DL::Data>_>)._M_impl.
                   super__Vector_impl_data._M_start; data_00 != pDVar1; data_00 = data_00 + 1) {
      DataGroup::add(&local_b0,data_00);
    }
    std::__cxx11::string::string((string *)&local_a0,"",&local_b1);
    Data::Data(__return_storage_ptr__,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    Data::setGroup(__return_storage_ptr__,&local_b0);
    DataGroup::~DataGroup(&local_b0);
  }
  else {
    Data::Data(__return_storage_ptr__,&local_80);
  }
  Data::~Data(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Data anonymous_func(const vector_t<Data>& args, VM& vm)
{
	Data d = union_func(args, vm);

	if (d.type() == DT_Group) {
		DataGroup grp;
		for (const Data& data : d.getGroup().getAnonymousEntries())
			grp.add(data);

		Data r;
		r.setGroup(grp);
		return r;
	}

	return d;
}